

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int wally_tx_get_witness_count(wally_tx *tx,size_t *written)

{
  _Bool _Var1;
  ulong local_28;
  size_t i;
  size_t *written_local;
  wally_tx *tx_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  _Var1 = is_valid_tx(tx);
  if ((_Var1) && (written != (size_t *)0x0)) {
    for (local_28 = 0; local_28 < tx->num_inputs; local_28 = local_28 + 1) {
      if (tx->inputs[local_28].witness != (wally_tx_witness_stack *)0x0) {
        *written = *written + 1;
      }
      if (tx->inputs[local_28].issuance_amount_rangeproof_len != 0) {
        *written = *written + 1;
      }
      if (tx->inputs[local_28].inflation_keys_rangeproof_len != 0) {
        *written = *written + 1;
      }
      if (tx->inputs[local_28].pegin_witness != (wally_tx_witness_stack *)0x0) {
        *written = *written + 1;
      }
    }
    for (local_28 = 0; local_28 < tx->num_outputs; local_28 = local_28 + 1) {
      if (tx->outputs[local_28].surjectionproof_len != 0) {
        *written = *written + 1;
      }
      if (tx->outputs[local_28].rangeproof_len != 0) {
        *written = *written + 1;
      }
    }
    tx_local._4_4_ = 0;
  }
  else {
    tx_local._4_4_ = -2;
  }
  return tx_local._4_4_;
}

Assistant:

int wally_tx_get_witness_count(const struct wally_tx *tx, size_t *written)
{
    size_t i;

    if (written)
        *written = 0;

    if (!is_valid_tx(tx) || !written)
        return WALLY_EINVAL;

    for (i = 0; i < tx->num_inputs; ++i) {
        if (tx->inputs[i].witness)
            *written += 1;
#ifdef BUILD_ELEMENTS
        /* TODO: check the count in the presence of a mix of NULL and non-NULL witnesses */
        if (tx->inputs[i].issuance_amount_rangeproof_len)
            *written += 1;
        if (tx->inputs[i].inflation_keys_rangeproof_len)
            *written += 1;
        if (tx->inputs[i].pegin_witness)
            *written += 1;
#endif
    }

#ifdef BUILD_ELEMENTS
    /* TODO: check the count in the presence of a mix of NULL and non-NULL witnesses */
    for (i = 0; i < tx->num_outputs; ++i) {
        if (tx->outputs[i].surjectionproof_len)
            *written += 1;
        if (tx->outputs[i].rangeproof_len)
            *written += 1;
    }
#endif

    return WALLY_OK;
}